

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ArenaReleaseOneofMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ArenaReleaseOneofMessageTest_Test *this)

{
  bool bVar1;
  TestOneof2 *message_00;
  Descriptor *this_00;
  Reflection *this_01;
  FieldDescriptor *pFVar2;
  Message *pMVar3;
  char *pcVar4;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  Message *released;
  Reflection *reflection;
  Descriptor *descriptor;
  TestOneof2 *message;
  Arena arena;
  GeneratedMessageReflectionTest_ArenaReleaseOneofMessageTest_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message);
  message_00 = Arena::Create<proto2_unittest::TestOneof2>((Arena *)&message);
  TestUtil::ReflectionTester::SetOneofViaReflection(&message_00->super_Message);
  this_00 = proto2_unittest::TestOneof2::descriptor();
  this_01 = proto2_unittest::TestOneof2::GetReflection();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "foo_lazy_message");
  pFVar2 = Descriptor::FindFieldByName(this_00,stack0xffffffffffffff08);
  pMVar3 = Reflection::ReleaseMessage
                     (this_01,&message_00->super_Message,pFVar2,(MessageFactory *)0x0);
  local_109 = pMVar3 != (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_108,(AssertionResult *)"released != nullptr","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x586,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  if (pMVar3 != (Message *)0x0) {
    (*(pMVar3->super_MessageLite)._vptr_MessageLite[1])();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,
             "foo_lazy_message");
  pFVar2 = Descriptor::FindFieldByName(this_00,stack0xfffffffffffffeb0);
  pMVar3 = Reflection::ReleaseMessage
                     (this_01,&message_00->super_Message,pFVar2,(MessageFactory *)0x0);
  local_161 = pMVar3 == (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_160,(AssertionResult *)"released == nullptr","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x58b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  Arena::~Arena((Arena *)&message);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ArenaReleaseOneofMessageTest) {
  Arena arena;
  unittest::TestOneof2* message = Arena::Create<unittest::TestOneof2>(&arena);
  TestUtil::ReflectionTester::SetOneofViaReflection(message);

  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message->GetReflection();
  Message* released = reflection->ReleaseMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));

  EXPECT_TRUE(released != nullptr);
  delete released;

  released = reflection->ReleaseMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released == nullptr);
}